

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irExpression *
new_ir_binop(Context_conflict *ctx,MOJOSHADER_irBinOpType op,MOJOSHADER_irExpression *left,
            MOJOSHADER_irExpression *right)

{
  MOJOSHADER_irBinOp *retval;
  MOJOSHADER_irExpression *right_local;
  MOJOSHADER_irExpression *left_local;
  MOJOSHADER_irBinOpType op_local;
  Context_conflict *ctx_local;
  
  if ((left == (MOJOSHADER_irExpression *)0x0) || (right == (MOJOSHADER_irExpression *)0x0)) {
    ctx_local = (Context_conflict *)0x0;
  }
  else {
    ctx_local = (Context_conflict *)Malloc(ctx,0x38);
    if (ctx_local == (Context_conflict *)0x0) {
      ctx_local = (Context_conflict *)0x0;
    }
    else {
      ctx_local->isfail = 3;
      ctx_local->malloc = (MOJOSHADER_malloc)ctx->sourcefile;
      *(uint *)&ctx_local->free = ctx->sourceline;
      *(MOJOSHADER_astDataTypeType *)&ctx_local->malloc_data = (left->info).type;
      *(int *)((long)&ctx_local->malloc_data + 4) = (left->info).elements;
      if ((left->info).type != (right->info).type) {
        __assert_fail("left->info.type == right->info.type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x1201,
                      "MOJOSHADER_irExpression *new_ir_binop(Context *, const MOJOSHADER_irBinOpType, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *)"
                     );
      }
      if ((left->info).elements != (right->info).elements) {
        __assert_fail("left->info.elements == right->info.elements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x1202,
                      "MOJOSHADER_irExpression *new_ir_binop(Context *, const MOJOSHADER_irBinOpType, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *)"
                     );
      }
      *(MOJOSHADER_irBinOpType *)&ctx_local->errors = op;
      ctx_local->warnings = (ErrorList *)left;
      ctx_local->strcache = (StringCache *)right;
    }
  }
  return (MOJOSHADER_irExpression *)ctx_local;
}

Assistant:

static MOJOSHADER_irExpression *new_ir_binop(Context *ctx,
                                       const MOJOSHADER_irBinOpType op,
                                       MOJOSHADER_irExpression *left,
                                       MOJOSHADER_irExpression *right)
{
    if ((!left) || (!right)) return NULL;
    NEW_IR_EXPR(retval, MOJOSHADER_irBinOp, MOJOSHADER_IR_BINOP, left->info.type, left->info.elements);
    assert(left->info.type == right->info.type);
    assert(left->info.elements == right->info.elements);
    retval->op = op;
    retval->left = left;
    retval->right = right;
    return (MOJOSHADER_irExpression *) retval;
}